

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

string * __thiscall
cfd::core::AbstractTransaction::GetHex_abi_cxx11_
          (string *__return_storage_ptr__,AbstractTransaction *this)

{
  ByteData local_30;
  AbstractTransaction *local_18;
  AbstractTransaction *this_local;
  
  local_18 = this;
  this_local = (AbstractTransaction *)__return_storage_ptr__;
  (*this->_vptr_AbstractTransaction[8])();
  ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&local_30);
  ByteData::~ByteData(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string AbstractTransaction::GetHex() const { return GetData().GetHex(); }